

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Int_t * Gia_ManDupTrimmedNonZero(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  Vec_Int_t *p_02;
  int *piVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  long lVar6;
  
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x851,"Vec_Int_t *Gia_ManDupTrimmedNonZero(Gia_Man_t *)");
  }
  p_00 = Gia_ManTransformMiter(p);
  p_01 = Gia_ManSeqStructSweep(p_00,1,1,0);
  Gia_ManStop(p_00);
  if (p_01->vCis->nSize <= p_01->nRegs) {
    __assert_fail("Gia_ManPiNum(pNonDual) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x855,"Vec_Int_t *Gia_ManDupTrimmedNonZero(Gia_Man_t *)");
  }
  if ((p_01->vCos->nSize - p_01->nRegs) * 2 != p->vCos->nSize - p->nRegs) {
    __assert_fail("2 * Gia_ManPoNum(pNonDual) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x856,"Vec_Int_t *Gia_ManDupTrimmedNonZero(Gia_Man_t *)");
  }
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 100;
  p_02->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_02->pArray = piVar3;
  pVVar4 = p_01->vCos;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p_01->nRegs < pVVar4->nSize) {
    lVar6 = 0;
    do {
      if ((int)uVar5 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[lVar6];
      if (((long)iVar2 < 0) || (p_01->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_01->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p_01->pObjs + iVar2;
      if ((~*(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
          0x1fffffff1fffffff) != 0) {
        Vec_IntPush(p_02,(int)lVar6);
      }
      lVar6 = lVar6 + 1;
      pVVar4 = p_01->vCos;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar6 < (long)(uVar5 - (long)p_01->nRegs));
  }
  Gia_ManStop(p_01);
  return p_02;
}

Assistant:

Vec_Int_t * Gia_ManDupTrimmedNonZero( Gia_Man_t * p )
{
    Vec_Int_t * vNonZero;
    Gia_Man_t * pTemp, * pNonDual;
    Gia_Obj_t * pObj;
    int i;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNonDual = Gia_ManTransformMiter( p );
    pNonDual = Gia_ManSeqStructSweep( pTemp = pNonDual, 1, 1, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNonDual) > 0 );
    assert( 2 * Gia_ManPoNum(pNonDual) == Gia_ManPoNum(p) );
    // skip PO pairs corresponding to const0 POs of the non-dual miter
    vNonZero = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pNonDual, pObj, i )
        if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            Vec_IntPush( vNonZero, i );
    Gia_ManStop( pNonDual );
    return vNonZero;
}